

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O0

void __thiscall QStringMatcher::QStringMatcher(QStringMatcher *this,QStringMatcher *other)

{
  undefined8 *in_RDI;
  QStringMatcher *in_stack_ffffffffffffffb8;
  QStringMatcher *this_00;
  undefined8 *local_28;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 1;
  this_00 = (QStringMatcher *)(in_RDI + 2);
  QString::QString((QString *)0x5029b8);
  QStringView::QStringView((QStringView *)(in_RDI + 5));
  local_28 = in_RDI + 7;
  do {
    *(undefined1 *)local_28 = 0;
    local_28 = (undefined8 *)((long)local_28 + 1);
  } while (local_28 != in_RDI + 0x27);
  operator=(this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

QStringMatcher::QStringMatcher(const QStringMatcher &other)
    : d_ptr(nullptr)
{
    operator=(other);
}